

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O3

ptrdiff_t __thiscall
soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::reMax
          (ClassSet<soplex::SVSetBase<double>::DLPSV> *this,int newmax)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int *piVar6;
  uint uVar7;
  Item *pIVar9;
  ulong uVar10;
  long lVar11;
  Item *newMem;
  Item *local_20;
  uint uVar8;
  
  uVar10 = (ulong)(uint)newmax;
  local_20 = (Item *)0x0;
  if (newmax < this->thesize) {
    uVar10 = (ulong)(uint)this->thesize;
  }
  uVar8 = this->firstfree;
  if ((this->themax ^ uVar8) == 0xffffffff) {
    piVar6 = &this->firstfree;
  }
  else {
    do {
      uVar7 = ~uVar8;
      uVar8 = this->theitem[(int)uVar7].info;
    } while ((this->themax ^ uVar8) != 0xffffffff);
    piVar6 = &this->theitem[(int)uVar7].info;
  }
  uVar7 = (uint)uVar10;
  *piVar6 = ~uVar7;
  spx_alloc<soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::Item*>(&local_20,uVar7);
  uVar8 = this->themax;
  if ((long)(int)uVar8 < 1) {
    uVar8 = 0;
  }
  else {
    pIVar9 = this->theitem;
    lVar11 = 0;
    do {
      if (local_20 != pIVar9) {
        *(undefined8 *)((long)&(local_20->data).super_SVectorBase<double>.m_elem + lVar11) =
             *(undefined8 *)((long)&(pIVar9->data).super_SVectorBase<double>.m_elem + lVar11);
        *(undefined8 *)((long)&(local_20->data).super_SVectorBase<double>.memsize + lVar11) =
             *(undefined8 *)((long)&(pIVar9->data).super_SVectorBase<double>.memsize + lVar11);
        puVar1 = (undefined4 *)((long)&(pIVar9->data).thenext + lVar11);
        uVar3 = puVar1[1];
        uVar4 = puVar1[2];
        uVar5 = puVar1[3];
        puVar2 = (undefined4 *)((long)&(local_20->data).thenext + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        puVar2[2] = uVar4;
        puVar2[3] = uVar5;
      }
      *(undefined4 *)((long)&local_20->info + lVar11) =
           *(undefined4 *)((long)&pIVar9->info + lVar11);
      lVar11 = lVar11 + 0x28;
    } while ((long)(int)uVar8 * 0x28 != lVar11);
  }
  if ((int)uVar8 < (int)uVar7) {
    pIVar9 = local_20 + uVar8;
    lVar11 = uVar10 - uVar8;
    do {
      (pIVar9->data).thenext = (DLPSV *)0x0;
      (pIVar9->data).theprev = (DLPSV *)0x0;
      (pIVar9->data).super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
      (pIVar9->data).super_SVectorBase<double>.memsize = 0;
      (pIVar9->data).super_SVectorBase<double>.memused = 0;
      *(undefined8 *)&pIVar9->info = 0;
      pIVar9 = pIVar9 + 1;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  lVar11 = (long)local_20 - (long)this->theitem;
  free(this->theitem);
  this->theitem = local_20;
  this->themax = uVar7;
  spx_realloc<soplex::DataKey*>(&this->thekey,uVar7);
  return lVar11;
}

Assistant:

ptrdiff_t reMax(int newmax = 0)
   {
      int i;
      Item* newMem = nullptr;
      newmax = (newmax < size()) ? size() : newmax;

      int* lastfree = &firstfree;

      while(*lastfree != -themax - 1)
         lastfree = &(theitem[ -1 - *lastfree].info);

      *lastfree = -newmax - 1;

      spx_alloc(newMem, newmax);

      /* call copy constructor for first elements */
      for(i = 0; i < max(); i++)
      {
         newMem[i].data = std::move(theitem[i].data);
         newMem[i].info = theitem[i].info;
      }

      /* call default constructor for remaining elements */
      for(; i < newmax; i++)
         new(&(newMem[i])) Item();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(theitem);

      spx_free(theitem);

      theitem = newMem;
      themax = newmax;

      spx_realloc(thekey,  themax);

      return pshift;
   }